

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_decoder.c
# Opt level: O0

lzma_ret delta_decode(lzma_coder_conflict *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  size_t sVar1;
  lzma_ret lVar2;
  lzma_ret ret;
  size_t out_start;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_coder_conflict *coder_local;
  
  sVar1 = *out_pos;
  if ((coder->next).code != (lzma_code_function_conflict)0x0) {
    lVar2 = (*(coder->next).code)
                      ((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    decode_buffer(coder,out + sVar1,*out_pos - sVar1);
    return lVar2;
  }
  __assert_fail("coder->next.code != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/delta/delta_decoder.c"
                ,0x27,
                "lzma_ret delta_decode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
               );
}

Assistant:

static lzma_ret
delta_decode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	const size_t out_start = *out_pos;
	lzma_ret ret;

	assert(coder->next.code != NULL);

	ret = coder->next.code(coder->next.coder, allocator,
			in, in_pos, in_size, out, out_pos, out_size,
			action);

	decode_buffer(coder, out + out_start, *out_pos - out_start);

	return ret;
}